

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

int XMLSearch_search_add_attribute
              (XMLSearch *search,SXML_CHAR *attr_name,SXML_CHAR *attr_value,int value_equal)

{
  int iVar1;
  char *__ptr;
  char *__ptr_00;
  XMLAttribute *pXVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  iVar3 = -1;
  if (attr_name == (SXML_CHAR *)0x0 || search == (XMLSearch *)0x0) {
    return -1;
  }
  if (*attr_name == '\0') {
    return -1;
  }
  __ptr = strdup(attr_name);
  if (attr_value == (SXML_CHAR *)0x0) {
LAB_00106782:
    pcVar4 = (char *)0x0;
  }
  else {
    __ptr_00 = strdup(attr_value);
    pcVar4 = __ptr_00;
    if (__ptr == (char *)0x0) {
      if (__ptr_00 == (char *)0x0) goto LAB_00106782;
    }
    else {
      if (__ptr_00 != (char *)0x0) goto LAB_00106785;
      __ptr_00 = __ptr;
      pcVar4 = (char *)0x0;
    }
    free(__ptr_00);
  }
LAB_00106785:
  iVar1 = search->n_attributes;
  lVar5 = (long)iVar1;
  pXVar2 = (XMLAttribute *)realloc(search->attributes,(lVar5 * 8 + 8) * 3);
  if (pXVar2 == (XMLAttribute *)0x0) {
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
    free(__ptr);
  }
  else {
    pXVar2[lVar5].name = __ptr;
    pXVar2[lVar5].value = pcVar4;
    pXVar2[lVar5].active = value_equal;
    search->n_attributes = iVar1 + 1;
    search->attributes = pXVar2;
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

int XMLSearch_search_add_attribute(XMLSearch* search, const SXML_CHAR* attr_name, const SXML_CHAR* attr_value, int value_equal)
{
	int i;
	XMLAttribute* pt;
	SXML_CHAR* name;
	SXML_CHAR* value;

	if (search == NULL)
		return -1;

	if (attr_name == NULL || attr_name[0] == NULC)
		return -1;

	name = sx_strdup(attr_name);
	value = (attr_value == NULL ? NULL : sx_strdup(attr_value));
	if (name == NULL || (attr_value && value == NULL)) {
		if (value != NULL)
			__free(value);
		if (name != NULL)
			__free(name);
	}

	i = search->n_attributes;
	pt = (XMLAttribute*)__realloc(search->attributes, (i + 1) * sizeof(XMLAttribute));
	if (pt == NULL) {
		if (value)
			__free(value);
		__free(name);
		return -1;
	}

	pt[i].name = name;
	pt[i].value = value;
	pt[i].active = value_equal;

	search->n_attributes = i+1;
	search->attributes = pt;

	return i;
}